

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  raw_ostream *prVar1;
  size_t in_RCX;
  uint uVar2;
  void *__buf_00;
  void *__buf;
  
  __buf = (void *)(ulong)NumSpaces;
  if (0x4f < NumSpaces) {
    do {
      __buf_00 = (void *)0x4f;
      if ((uint)__buf < 0x4f) {
        __buf_00 = __buf;
      }
      write(this,0x1ee990,__buf_00,in_RCX);
      uVar2 = (uint)__buf - (int)__buf_00;
      __buf = (void *)(ulong)uVar2;
    } while (uVar2 != 0);
    return this;
  }
  prVar1 = (raw_ostream *)write(this,0x1ee990,__buf,in_RCX);
  return prVar1;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}